

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

int xercesc_4_0::Base64::getDataLength(XMLCh *inputData,MemoryManager *manager,Conformance conform)

{
  XMLByte *buffer;
  XMLByte *decodedData;
  XMLSize_t retLen;
  MemoryManager *pMStack_20;
  Conformance conform_local;
  MemoryManager *manager_local;
  XMLCh *inputData_local;
  
  decodedData = (XMLByte *)0x0;
  retLen._4_4_ = conform;
  pMStack_20 = manager;
  manager_local = (MemoryManager *)inputData;
  buffer = decodeToXMLByte(inputData,(XMLSize_t *)&decodedData,manager,conform);
  if (buffer == (XMLByte *)0x0) {
    inputData_local._4_4_ = -1;
  }
  else {
    returnExternalMemory(pMStack_20,buffer);
    inputData_local._4_4_ = (int)decodedData;
  }
  return inputData_local._4_4_;
}

Assistant:

int Base64::getDataLength(const XMLCh*         const inputData
                        ,       MemoryManager* const manager
                        ,       Conformance          conform )

{
    XMLSize_t retLen = 0;
    XMLByte* decodedData = decodeToXMLByte(inputData, &retLen, manager, conform);

    if ( !decodedData )
        return -1;
    else
    {
        returnExternalMemory(manager, decodedData);
        return (int)retLen;
    }
}